

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::EnumDescriptorProto::ByteSizeLong(EnumDescriptorProto *this)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  Type *value;
  size_t sVar2;
  size_t sVar3;
  uint i;
  uint uVar4;
  
  uVar4 = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar3 = 0;
  }
  else {
    unknown_fields = EnumDescriptorProto::unknown_fields(this);
    sVar3 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar1 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
  sVar3 = sVar3 + uVar1;
  for (; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                      (&(this->value_).super_RepeatedPtrFieldBase,uVar4);
    sVar2 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::EnumValueDescriptorProto>(value);
    sVar3 = sVar3 + sVar2;
  }
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 3) != 0) {
    if ((uVar4 & 1) != 0) {
      sVar2 = internal::WireFormatLite::StringSize((this->name_).ptr_);
      sVar3 = sVar3 + sVar2 + 1;
      uVar4 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar4 & 2) != 0) {
      sVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::EnumOptions>
                        (this->options_);
      sVar3 = sVar3 + sVar2 + 1;
    }
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t EnumDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumDescriptorProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  {
    unsigned int count = this->value_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->value(i));
    }
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.EnumOptions options = 3;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->options_);
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}